

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpu_ctrl.cpp
# Opt level: O2

void __thiscall FPUCtl::leave(FPUCtl *this)

{
  if (this->in_mode == true) {
    MXCSR = this->sse_state;
    this->in_mode = false;
  }
  return;
}

Assistant:

void FPUCtl::leave()
{
    if(!this->in_mode) return;

#if defined(HAVE_SSE_INTRINSICS)
    _mm_setcsr(this->sse_state);

#elif defined(__GNUC__) && defined(HAVE_SSE)

    if((CPUCapFlags&CPU_CAP_SSE))
        __asm__ __volatile__("ldmxcsr %0" : : "m" (*&this->sse_state));
#endif
    this->in_mode = false;
}